

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGrid.cpp
# Opt level: O0

void __thiscall
TasGrid::TasmanianSparseGrid::setSurplusRefinement
          (TasmanianSparseGrid *this,double tolerance,TypeRefinement criteria,int output,
          vector<int,_std::allocator<int>_> *level_limits,
          vector<double,_std::allocator<double>_> *scale_correction)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  runtime_error *this_00;
  pointer pBVar4;
  size_type sVar5;
  invalid_argument *piVar6;
  double *local_80;
  size_type local_48;
  size_t nscale;
  int dims;
  vector<double,_std::allocator<double>_> *scale_correction_local;
  vector<int,_std::allocator<int>_> *level_limits_local;
  int output_local;
  TypeRefinement criteria_local;
  double tolerance_local;
  TasmanianSparseGrid *this_local;
  
  bVar1 = empty(this);
  if (bVar1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error
              (this_00,
               "ERROR: calling setSurplusRefinement() for a grid that has not been initialized");
    __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  pBVar4 = ::std::
           unique_ptr<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
           ::operator->(&this->base);
  iVar2 = BaseCanonicalGrid::getNumDimensions(pBVar4);
  pBVar4 = ::std::
           unique_ptr<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
           ::operator->(&this->base);
  iVar3 = BaseCanonicalGrid::getNumNeeded(pBVar4);
  local_48 = (size_type)iVar3;
  if (output != -1) {
    pBVar4 = ::std::
             unique_ptr<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
             ::operator->(&this->base);
    iVar3 = BaseCanonicalGrid::getNumOutputs(pBVar4);
    local_48 = (long)iVar3 * local_48;
  }
  bVar1 = ::std::vector<int,_std::allocator<int>_>::empty(level_limits);
  if (!bVar1) {
    sVar5 = ::std::vector<int,_std::allocator<int>_>::size(level_limits);
    if (sVar5 != (long)iVar2) {
      piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
      ::std::invalid_argument::invalid_argument
                (piVar6,
                 "ERROR: setSurplusRefinement() requires level_limits with either 0 or dimenions entries"
                );
      __cxa_throw(piVar6,&::std::invalid_argument::typeinfo,
                  ::std::invalid_argument::~invalid_argument);
    }
  }
  bVar1 = ::std::vector<double,_std::allocator<double>_>::empty(scale_correction);
  if (!bVar1) {
    sVar5 = ::std::vector<double,_std::allocator<double>_>::size(scale_correction);
    if (sVar5 != local_48) {
      piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
      ::std::invalid_argument::invalid_argument
                (piVar6,"ERROR: setSurplusRefinement() incorrect size for scale_correction");
      __cxa_throw(piVar6,&::std::invalid_argument::typeinfo,
                  ::std::invalid_argument::~invalid_argument);
    }
  }
  bVar1 = ::std::vector<int,_std::allocator<int>_>::empty(level_limits);
  if (!bVar1) {
    ::std::vector<int,_std::allocator<int>_>::operator=(&this->llimits,level_limits);
  }
  bVar1 = ::std::vector<double,_std::allocator<double>_>::empty(scale_correction);
  if (bVar1) {
    local_80 = (double *)0x0;
  }
  else {
    local_80 = ::std::vector<double,_std::allocator<double>_>::data(scale_correction);
  }
  setSurplusRefinement(this,tolerance,criteria,output,(int *)0x0,local_80);
  return;
}

Assistant:

void TasmanianSparseGrid::setSurplusRefinement(double tolerance, TypeRefinement criteria, int output, const std::vector<int> &level_limits, const std::vector<double> &scale_correction){
    if (empty()) throw std::runtime_error("ERROR: calling setSurplusRefinement() for a grid that has not been initialized");
    int dims = base->getNumDimensions();
    size_t nscale = (size_t) base->getNumNeeded();
    if (output != -1) nscale *= (size_t) base->getNumOutputs();
    if ((!level_limits.empty()) && (level_limits.size() != (size_t) dims)) throw std::invalid_argument("ERROR: setSurplusRefinement() requires level_limits with either 0 or dimenions entries");
    if ((!scale_correction.empty()) && (scale_correction.size() != nscale)) throw std::invalid_argument("ERROR: setSurplusRefinement() incorrect size for scale_correction");

    if (!level_limits.empty()) llimits = level_limits;
    setSurplusRefinement(tolerance, criteria, output, nullptr, (scale_correction.empty()) ? nullptr : scale_correction.data());
}